

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

void Lf_ManCountMapRefsOne(Lf_Man_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  Lf_Bst_t *p_00;
  Lf_Cut_t *pCut_00;
  float fVar3;
  int local_2c;
  int Required;
  int k;
  Lf_Cut_t *pCut;
  Lf_Bst_t *pBest;
  int iObj_local;
  Lf_Man_t *p_local;
  
  p_00 = Lf_ObjReadBest(p,iObj);
  pCut_00 = Lf_ObjCutBest(p,iObj);
  iVar1 = Lf_ObjRequired(p,iObj);
  iVar2 = Lf_ObjMapRefNum(p,iObj);
  if (iVar2 < 1) {
    __assert_fail("Lf_ObjMapRefNum(p, iObj) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x62e,"void Lf_ManCountMapRefsOne(Lf_Man_t *, int)");
  }
  iVar2 = Lf_BestIsMapped(p_00);
  if (iVar2 != 0) {
    if ((*(uint *)&pCut_00->field_0x14 >> 0x17 & 1) == 0) {
      for (local_2c = 0; local_2c < (int)(*(uint *)&pCut_00->field_0x14 >> 0x18);
          local_2c = local_2c + 1) {
        Lf_ObjSetRequired(p,*(int *)((long)&pCut_00[1].Sign + (long)local_2c * 4),iVar1 + -1);
      }
      iVar1 = Vec_FltSize(&p->vSwitches);
      if (iVar1 != 0) {
        fVar3 = Lf_CutSwitches(p,pCut_00);
        p->Switches = (double)fVar3 + p->Switches;
      }
      p->pPars->Edge = (ulong)(*(uint *)&pCut_00->field_0x14 >> 0x18) + p->pPars->Edge;
      p->pPars->Area = p->pPars->Area + 1;
      return;
    }
    __assert_fail("!pCut->fMux7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x630,"void Lf_ManCountMapRefsOne(Lf_Man_t *, int)");
  }
  __assert_fail("Lf_BestIsMapped(pBest)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                ,0x62f,"void Lf_ManCountMapRefsOne(Lf_Man_t *, int)");
}

Assistant:

void Lf_ManCountMapRefsOne( Lf_Man_t * p, int iObj )
{
    Lf_Bst_t * pBest = Lf_ObjReadBest( p, iObj );
    Lf_Cut_t * pCut = Lf_ObjCutBest( p, iObj );
    int k ,Required = Lf_ObjRequired( p, iObj );
    assert( Lf_ObjMapRefNum(p, iObj) > 0 );
    assert( Lf_BestIsMapped(pBest) );
    assert( !pCut->fMux7 );
//    assert( pCut->Delay <= Required );
    for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Lf_ObjSetRequired( p, pCut->pLeaves[k], Required - 1 );
    if ( Vec_FltSize(&p->vSwitches) )
        p->Switches += Lf_CutSwitches(p, pCut);
    p->pPars->Edge += pCut->nLeaves;
    p->pPars->Area++;
}